

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

HighsStatus calculateColDualsQuad(HighsLp *lp,HighsSolution *solution)

{
  int iVar1;
  pointer pdVar2;
  bool bVar3;
  HighsStatus HVar4;
  pointer piVar5;
  pointer pHVar6;
  pointer pdVar7;
  long lVar8;
  long lVar9;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> col_dual_quad;
  value_type local_48;
  
  pdVar7 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = lp->num_row_;
  bVar3 = HighsSparseMatrix::isColwise(&lp->a_matrix_);
  HVar4 = kError;
  if ((bVar3) && (iVar1 == (int)((ulong)((long)pdVar7 - (long)pdVar2) >> 3))) {
    col_dual_quad.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    col_dual_quad.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    col_dual_quad.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.hi = 0.0;
    local_48.lo = 0.0;
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::_M_fill_assign
              (&col_dual_quad,(long)lp->num_col_,&local_48);
    lVar9 = 0;
    while (lVar9 < lp->num_col_) {
      piVar5 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar8 = (long)piVar5[lVar9]; lVar8 < piVar5[lVar9 + 1]; lVar8 = lVar8 + 1) {
        HighsCDouble::operator+=
                  (col_dual_quad.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar9,
                   (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar8]] *
                   (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar8]);
        piVar5 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      HighsCDouble::operator+=
                (col_dual_quad.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar9,
                 (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9]);
      lVar9 = lVar9 + 1;
    }
    std::vector<double,_std::allocator<double>_>::resize(&solution->col_dual,(long)lp->num_col_);
    pdVar7 = (solution->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (pHVar6 = col_dual_quad.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pHVar6 != col_dual_quad.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pHVar6 = pHVar6 + 1) {
      *pdVar7 = pHVar6->hi + pHVar6->lo;
      pdVar7 = pdVar7 + 1;
    }
    std::_Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>::~_Vector_base
              (&col_dual_quad.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>);
    HVar4 = kOk;
  }
  return HVar4;
}

Assistant:

HighsStatus calculateColDualsQuad(const HighsLp& lp, HighsSolution& solution) {
  const bool correct_size = int(solution.row_dual.size()) == lp.num_row_;
  const bool is_colwise = lp.a_matrix_.isColwise();
  const bool data_error = !correct_size || !is_colwise;
  assert(!data_error);
  if (data_error) return HighsStatus::kError;

  std::vector<HighsCDouble> col_dual_quad;
  col_dual_quad.assign(lp.num_col_, HighsCDouble{0.0});

  for (HighsInt col = 0; col < lp.num_col_; col++) {
    for (HighsInt i = lp.a_matrix_.start_[col];
         i < lp.a_matrix_.start_[col + 1]; i++) {
      const HighsInt row = lp.a_matrix_.index_[i];
      assert(row >= 0);
      assert(row < lp.num_row_);
      col_dual_quad[col] += solution.row_dual[row] * lp.a_matrix_.value_[i];
    }
    col_dual_quad[col] += lp.col_cost_[col];
  }

  // assign quad values to double vector
  solution.col_dual.resize(lp.num_col_);
  std::transform(col_dual_quad.begin(), col_dual_quad.end(),
                 solution.col_dual.begin(),
                 [](HighsCDouble x) { return double(x); });

  return HighsStatus::kOk;
}